

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

void __thiscall QMessageBox::showEvent(QMessageBox *this,QShowEvent *e)

{
  long lVar1;
  QMessageBoxPrivate *pQVar2;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QMessageBoxPrivate *d;
  QAccessibleEvent event;
  QAccessibleEvent *this_00;
  QMessageBoxPrivate *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QMessageBox *)0x7a69af);
  pQVar2->clickedButton = (QAbstractButton *)0x0;
  QMessageBoxPrivate::updateSize(in_stack_ffffffffffffffd8);
  this_00 = (QAccessibleEvent *)&stack0xffffffffffffffd8;
  QAccessibleEvent::QAccessibleEvent(this_00,in_RDI,Alert);
  QAccessible::updateAccessibility((QAccessibleEvent *)this_00);
  QDialog::showEvent((QDialog *)this_00,(QShowEvent *)in_RDI);
  QAccessibleEvent::~QAccessibleEvent(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMessageBox::showEvent(QShowEvent *e)
{
    Q_D(QMessageBox);
    d->clickedButton = nullptr;
    d->updateSize();

#if QT_CONFIG(accessibility)
    QAccessibleEvent event(this, QAccessible::Alert);
    QAccessible::updateAccessibility(&event);
#endif
#if defined(Q_OS_WIN)
    if (const HMENU systemMenu = qt_getWindowsSystemMenu(this)) {
        EnableMenuItem(systemMenu, SC_CLOSE, d->detectedEscapeButton ?
                       MF_BYCOMMAND|MF_ENABLED : MF_BYCOMMAND|MF_GRAYED);
    }
#endif
    QDialog::showEvent(e);
}